

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O0

ssize_t __thiscall
zmq::socket_base_t::send(socket_base_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  uint64_t uVar5;
  undefined4 in_register_00000034;
  EVP_PKEY_CTX *this_00;
  EVP_PKEY_CTX *ctx;
  uint64_t end;
  int timeout;
  char *errstr_1;
  char *errstr;
  int rc;
  scoped_optional_lock_t sync_lock;
  mutex_t *in_stack_ffffffffffffff38;
  msg_t *in_stack_ffffffffffffff40;
  clock_t *in_stack_ffffffffffffff48;
  msg_t *local_a0;
  byte local_71;
  int local_54;
  undefined1 in_stack_ffffffffffffffcb;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint local_4;
  
  this_00 = (EVP_PKEY_CTX *)CONCAT44(in_register_00000034,__fd);
  scoped_optional_lock_t::scoped_optional_lock_t
            ((scoped_optional_lock_t *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if ((this->_ctx_terminated & 1U) == 0) {
    local_71 = 1;
    if (this_00 != (EVP_PKEY_CTX *)0x0) {
      bVar1 = msg_t::check((msg_t *)this_00);
      local_71 = bVar1 ^ 0xff;
    }
    if ((local_71 & 1) == 0) {
      iVar2 = process_commands((socket_base_t *)
                               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                               in_stack_ffffffffffffffcc,(bool)in_stack_ffffffffffffffcb);
      if (iVar2 == 0) {
        msg_t::reset_flags((msg_t *)this_00,'\x01');
        if (((ulong)__buf & 2) != 0) {
          msg_t::set_flags((msg_t *)this_00,'\x01');
        }
        msg_t::reset_metadata(in_stack_ffffffffffffff40);
        ctx = this_00;
        iVar2 = (*(this->super_own_t).super_object_t._vptr_object_t[0x23])();
        if (iVar2 == 0) {
          local_4 = 0;
        }
        else if (((iVar2 == -2) && (((ulong)__buf & 1) == 0)) &&
                ((this->super_own_t).options.sndtimeo != 0)) {
          iVar2 = msg_t::close((msg_t *)this_00,(int)ctx);
          if (iVar2 != 0) {
            piVar3 = __errno_location();
            pcVar4 = strerror(*piVar3);
            ctx = (EVP_PKEY_CTX *)0x32b5b5;
            fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
                    ,0x4f5);
            fflush(_stderr);
            zmq_abort((char *)0x2d442d);
          }
          iVar2 = msg_t::init((msg_t *)this_00,ctx);
          if (iVar2 != 0) {
            piVar3 = __errno_location();
            pcVar4 = strerror(*piVar3);
            fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
                    ,0x4f7);
            fflush(_stderr);
            zmq_abort((char *)0x2d44bf);
          }
          local_4 = 0;
        }
        else {
          piVar3 = __errno_location();
          if (*piVar3 == 0xb) {
            if ((((ulong)__buf & 1) == 0) && ((this->super_own_t).options.sndtimeo != 0)) {
              local_54 = (this->super_own_t).options.sndtimeo;
              if (local_54 < 0) {
                local_a0 = (msg_t *)0x0;
              }
              else {
                uVar5 = clock_t::now_ms(in_stack_ffffffffffffff48);
                local_a0 = (msg_t *)(uVar5 + (long)local_54);
              }
              do {
                do {
                  iVar2 = process_commands((socket_base_t *)
                                           CONCAT44(in_stack_ffffffffffffffd4,
                                                    in_stack_ffffffffffffffd0),
                                           in_stack_ffffffffffffffcc,(bool)in_stack_ffffffffffffffcb
                                          );
                  if (iVar2 != 0) {
                    local_4 = 0xffffffff;
                    goto LAB_002d46af;
                  }
                  iVar2 = (*(this->super_own_t).super_object_t._vptr_object_t[0x23])(this,this_00);
                  if (iVar2 == 0) {
                    local_4 = 0;
                    goto LAB_002d46af;
                  }
                  piVar3 = __errno_location();
                  if (*piVar3 != 0xb) {
                    local_4 = 0xffffffff;
                    goto LAB_002d46af;
                  }
                } while (local_54 < 1);
                in_stack_ffffffffffffff40 = local_a0;
                in_stack_ffffffffffffff48 = (clock_t *)clock_t::now_ms(in_stack_ffffffffffffff48);
                local_54 = (int)in_stack_ffffffffffffff40 - (int)in_stack_ffffffffffffff48;
              } while (0 < local_54);
              piVar3 = __errno_location();
              *piVar3 = 0xb;
              local_4 = 0xffffffff;
            }
            else {
              local_4 = 0xffffffff;
            }
          }
          else {
            local_4 = 0xffffffff;
          }
        }
      }
      else {
        local_4 = 0xffffffff;
      }
    }
    else {
      piVar3 = __errno_location();
      *piVar3 = 0xe;
      local_4 = 0xffffffff;
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x9523dfd;
    local_4 = 0xffffffff;
  }
LAB_002d46af:
  scoped_optional_lock_t::~scoped_optional_lock_t
            ((scoped_optional_lock_t *)in_stack_ffffffffffffff40);
  return (ulong)local_4;
}

Assistant:

int zmq::socket_base_t::send (msg_t *msg_, int flags_)
{
    scoped_optional_lock_t sync_lock (_thread_safe ? &_sync : NULL);

    //  Check whether the context hasn't been shut down yet.
    if (unlikely (_ctx_terminated)) {
        errno = ETERM;
        return -1;
    }

    //  Check whether message passed to the function is valid.
    if (unlikely (!msg_ || !msg_->check ())) {
        errno = EFAULT;
        return -1;
    }

    //  Process pending commands, if any.
    int rc = process_commands (0, true);
    if (unlikely (rc != 0)) {
        return -1;
    }

    //  Clear any user-visible flags that are set on the message.
    msg_->reset_flags (msg_t::more);

    //  At this point we impose the flags on the message.
    if (flags_ & ZMQ_SNDMORE)
        msg_->set_flags (msg_t::more);

    msg_->reset_metadata ();

    //  Try to send the message using method in each socket class
    rc = xsend (msg_);
    if (rc == 0) {
        return 0;
    }
    //  Special case for ZMQ_PUSH: -2 means pipe is dead while a
    //  multi-part send is in progress and can't be recovered, so drop
    //  silently when in blocking mode to keep backward compatibility.
    if (unlikely (rc == -2)) {
        if (!((flags_ & ZMQ_DONTWAIT) || options.sndtimeo == 0)) {
            rc = msg_->close ();
            errno_assert (rc == 0);
            rc = msg_->init ();
            errno_assert (rc == 0);
            return 0;
        }
    }
    if (unlikely (errno != EAGAIN)) {
        return -1;
    }

    //  In case of non-blocking send we'll simply propagate
    //  the error - including EAGAIN - up the stack.
    if ((flags_ & ZMQ_DONTWAIT) || options.sndtimeo == 0) {
        return -1;
    }

    //  Compute the time when the timeout should occur.
    //  If the timeout is infinite, don't care.
    int timeout = options.sndtimeo;
    const uint64_t end = timeout < 0 ? 0 : (_clock.now_ms () + timeout);

    //  Oops, we couldn't send the message. Wait for the next
    //  command, process it and try to send the message again.
    //  If timeout is reached in the meantime, return EAGAIN.
    while (true) {
        if (unlikely (process_commands (timeout, false) != 0)) {
            return -1;
        }
        rc = xsend (msg_);
        if (rc == 0)
            break;
        if (unlikely (errno != EAGAIN)) {
            return -1;
        }
        if (timeout > 0) {
            timeout = static_cast<int> (end - _clock.now_ms ());
            if (timeout <= 0) {
                errno = EAGAIN;
                return -1;
            }
        }
    }

    return 0;
}